

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::
     LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *p_svec,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *p_lhs,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *p_rhs)

{
  bool bVar1;
  type_conflict5 tVar2;
  double *pdVar3;
  ostream *in_RSI;
  type *in_R8;
  ostream *in_R9;
  bool in_stack_00000057;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000058;
  NameSet *in_stack_00000060;
  ostream *in_stack_00000068;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000070;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff18;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffffa8;
  
  LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
             in_stack_00000057);
  bVar1 = boost::multiprecision::operator==
                    (in_stack_ffffffffffffff18,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x16fba4);
  if (bVar1) {
    std::operator<<(in_RSI," = ");
    boost::multiprecision::operator<<(in_R9,in_stack_ffffffffffffffa8);
  }
  else {
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_ffffffffffffff30,-*pdVar3,in_R8);
    tVar2 = boost::multiprecision::operator<=
                      (in_stack_ffffffffffffff18,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x16fc68);
    if (tVar2) {
      std::operator<<(in_RSI," <= ");
      boost::multiprecision::operator<<(in_R9,in_stack_ffffffffffffffa8);
    }
    else {
      std::operator<<(in_RSI," >= ");
      boost::multiprecision::operator<<(in_R9,in_stack_ffffffffffffffa8);
    }
  }
  std::operator<<(in_RSI,"\n");
  return;
}

Assistant:

static void LPFwriteRow(
   const SPxLPBase<R>&   p_lp,       ///< the LP
   std::ostream&         p_output,   ///< output stream
   const NameSet*        p_cnames,   ///< column names
   const SVectorBase<R>& p_svec,     ///< vector of the row
   const R&              p_lhs,      ///< lhs of the row
   const R&              p_rhs       ///< rhs of the row
)
{

   LPFwriteSVector(p_lp, p_output, p_cnames, p_svec);

   if(p_lhs == p_rhs)
      p_output << " = " << p_rhs;
   else if(p_lhs <= R(-infinity))
      p_output << " <= " << p_rhs;
   else
   {
      assert(p_rhs >= R(infinity));
      p_output << " >= " << p_lhs;
   }

   p_output << "\n";
}